

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

qpdf_oh qpdf_oh_new_real_from_string(qpdf_data qpdf,char *value)

{
  qpdf_oh qVar1;
  allocator<char> local_41;
  undefined1 local_40 [48];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_40 + 0x10),value,&local_41);
  QPDFObjectHandle::newReal((string *)local_40);
  qVar1 = new_object(qpdf,(QPDFObjectHandle *)local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  return qVar1;
}

Assistant:

qpdf_oh
qpdf_oh_new_real_from_string(qpdf_data qpdf, char const* value)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_oh_new_real_from_string");
    return new_object(qpdf, QPDFObjectHandle::newReal(value));
}